

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isCubeLevelSampleResultValid
               (ConstPixelBufferAccess (*level) [6],Sampler *sampler,FilterMode filterMode,
               LookupPrecision *prec,CubeFaceFloatCoords *coords,Vec4 *result)

{
  CubeFace CVar1;
  Vector<float,_2> local_50;
  Vector<float,_2> local_48;
  Vec4 *local_40;
  Vec4 *result_local;
  CubeFaceFloatCoords *coords_local;
  LookupPrecision *prec_local;
  Sampler *pSStack_20;
  FilterMode filterMode_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess (*level_local) [6];
  
  local_40 = result;
  result_local = (Vec4 *)coords;
  coords_local = (CubeFaceFloatCoords *)prec;
  prec_local._4_4_ = filterMode;
  pSStack_20 = sampler;
  sampler_local = (Sampler *)level;
  if (filterMode == LINEAR) {
    if ((sampler->seamlessCubeMap & 1U) == 0) {
      CVar1 = coords->face;
      Vector<float,_2>::Vector(&local_48,coords->s,coords->t);
      level_local._7_1_ =
           isLinearSampleResultValid(*level + CVar1,sampler,prec,&local_48,0,local_40);
    }
    else {
      level_local._7_1_ = isSeamlessLinearSampleResultValid(level,sampler,prec,coords,result);
    }
  }
  else {
    CVar1 = coords->face;
    Vector<float,_2>::Vector(&local_50,coords->s,coords->t);
    level_local._7_1_ =
         isNearestSampleResultValid<tcu::LookupPrecision,float>
                   (*level + CVar1,sampler,prec,&local_50,0,local_40);
  }
  return level_local._7_1_;
}

Assistant:

static bool isCubeLevelSampleResultValid (const ConstPixelBufferAccess		(&level)[CUBEFACE_LAST],
										  const Sampler&					sampler,
										  const Sampler::FilterMode			filterMode,
										  const LookupPrecision&			prec,
										  const CubeFaceFloatCoords&		coords,
										  const Vec4&						result)
{
	if (filterMode == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamlessLinearSampleResultValid(level, sampler, prec, coords, result);
		else
			return isLinearSampleResultValid(level[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, result);
	}
	else
		return isNearestSampleResultValid(level[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, result);
}